

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

bool __thiscall
FState::CallAction(FState *this,AActor *self,AActor *stateowner,FStateParamInfo *info,
                  FState **stateret)

{
  int iVar1;
  uint uVar2;
  PType **ppPVar3;
  VMValue *local_d0;
  undefined1 local_90 [8];
  VMReturn ret;
  undefined1 local_78 [8];
  VMValue params [3];
  FState **local_38;
  FState **stateret_local;
  FStateParamInfo *info_local;
  AActor *stateowner_local;
  AActor *self_local;
  FState *this_local;
  
  if (this->ActionFunc == (VMFunction *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    cycle_t::Clock(&ActionCycles);
    if ((CallAction(AActor*,AActor*,FStateParamInfo*,FState**)::stack == '\0') &&
       (iVar1 = __cxa_guard_acquire(&CallAction(AActor*,AActor*,FStateParamInfo*,FState**)::stack),
       iVar1 != 0)) {
      VMFrameStack::VMFrameStack(&CallAction::stack);
      __cxa_atexit(VMFrameStack::~VMFrameStack,&CallAction::stack,&__dso_handle);
      __cxa_guard_release(&CallAction(AActor*,AActor*,FStateParamInfo*,FState**)::stack);
    }
    ret._8_8_ = local_78;
    VMValue::VMValue((VMValue *)ret._8_8_,(DObject *)self);
    ret._8_8_ = (long)&params[0].field_0 + 8;
    VMValue::VMValue((VMValue *)ret._8_8_,(DObject *)stateowner);
    ret._8_8_ = (long)&params[1].field_0 + 8;
    VMValue::VMValue((VMValue *)ret._8_8_,info,8);
    local_38 = stateret;
    if ((stateret != (FState **)0x0) &&
       (((*stateret = (FState *)0x0, this->ActionFunc->Proto == (PPrototype *)0x0 ||
         (uVar2 = TArray<PType_*,_PType_*>::Size(&this->ActionFunc->Proto->ReturnTypes), uVar2 == 0)
         ) || (ppPVar3 = TArray<PType_*,_PType_*>::operator[]
                                   (&this->ActionFunc->Proto->ReturnTypes,0),
              *ppPVar3 != (PType *)TypeState)))) {
      local_38 = (FState **)0x0;
    }
    if (local_38 == (FState **)0x0) {
      VMFrameStack::Call(&CallAction::stack,this->ActionFunc,(VMValue *)local_78,3,(VMReturn *)0x0,0
                         ,(VMException **)0x0);
    }
    else {
      VMReturn::PointerAt((VMReturn *)local_90,local_38);
      VMFrameStack::Call(&CallAction::stack,this->ActionFunc,(VMValue *)local_78,3,
                         (VMReturn *)local_90,1,(VMException **)0x0);
    }
    cycle_t::Unclock(&ActionCycles);
    this_local._7_1_ = true;
    local_d0 = (VMValue *)((long)&params[2].field_0 + 8);
    do {
      local_d0 = local_d0 + -1;
      VMValue::~VMValue(local_d0);
    } while (local_d0 != (VMValue *)local_78);
  }
  return this_local._7_1_;
}

Assistant:

bool FState::CallAction(AActor *self, AActor *stateowner, FStateParamInfo *info, FState **stateret)
{
	if (ActionFunc != NULL)
	{
		ActionCycles.Clock();

		static VMFrameStack stack;
		VMValue params[3] = { self, stateowner, VMValue(info, ATAG_STATEINFO) };
		// If the function returns a state, store it at *stateret.
		// If it doesn't return a state but stateret is non-NULL, we need
		// to set *stateret to NULL.
		if (stateret != NULL)
		{
			*stateret = NULL;
			if (ActionFunc->Proto == NULL ||
				ActionFunc->Proto->ReturnTypes.Size() == 0 ||
				ActionFunc->Proto->ReturnTypes[0] != TypeState)
			{
				stateret = NULL;
			}
		}
		if (stateret == NULL)
		{
			stack.Call(ActionFunc, params, countof(params), NULL, 0, NULL);
		}
		else
		{
			VMReturn ret;
			ret.PointerAt((void **)stateret);
			stack.Call(ActionFunc, params, countof(params), &ret, 1, NULL);
		}
		ActionCycles.Unclock();
		return true;
	}
	else
	{
		return false;
	}
}